

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
__thiscall duckdb::ZSTDStorage::DeserializeState(ZSTDStorage *this,Deserializer *deserializer)

{
  pointer pSVar1;
  _Head_base<0UL,_duckdb::SerializedStringSegmentState_*,_false> local_20;
  
  make_uniq<duckdb::SerializedStringSegmentState>();
  pSVar1 = unique_ptr<duckdb::SerializedStringSegmentState,_std::default_delete<duckdb::SerializedStringSegmentState>,_true>
           ::operator->((unique_ptr<duckdb::SerializedStringSegmentState,_std::default_delete<duckdb::SerializedStringSegmentState>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::vector<long,true>>
            (deserializer,1,"overflow_blocks",&(pSVar1->super_ColumnSegmentState).blocks);
  *(SerializedStringSegmentState **)this = local_20._M_head_impl;
  return (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         (unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>)
         this;
}

Assistant:

unique_ptr<ColumnSegmentState> ZSTDStorage::DeserializeState(Deserializer &deserializer) {
	auto result = make_uniq<SerializedStringSegmentState>();
	deserializer.ReadProperty(1, "overflow_blocks", result->blocks);
	return std::move(result);
}